

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O2

void read_calendar_record
               (calendar_record_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  service_availability_t sVar2;
  char *pcVar3;
  calendar_record_t *__dest;
  ulong uVar4;
  ulong uVar5;
  
  init_calendar_record(record);
  uVar4 = 0;
  uVar5 = (ulong)(uint)field_count;
  if (field_count < 1) {
    uVar5 = uVar4;
  }
  do {
    if (uVar5 == uVar4) {
      return;
    }
    pcVar3 = field_names[uVar4];
    iVar1 = strcmp(pcVar3,"service_id");
    if (iVar1 == 0) {
      pcVar3 = field_values[uVar4];
      __dest = record;
LAB_00104a83:
      strcpy(__dest->service_id,pcVar3);
    }
    else {
      iVar1 = strcmp(pcVar3,"start_date");
      if (iVar1 == 0) {
        pcVar3 = field_values[uVar4];
        __dest = (calendar_record_t *)record->start_date;
        goto LAB_00104a83;
      }
      iVar1 = strcmp(pcVar3,"end_date");
      if (iVar1 == 0) {
        pcVar3 = field_values[uVar4];
        __dest = (calendar_record_t *)record->end_date;
        goto LAB_00104a83;
      }
      iVar1 = strcmp(pcVar3,"monday");
      if (iVar1 == 0) {
        sVar2 = parse_service_availability(field_values[uVar4]);
        record->monday = sVar2;
      }
      else {
        iVar1 = strcmp(pcVar3,"tuesday");
        if (iVar1 == 0) {
          sVar2 = parse_service_availability(field_values[uVar4]);
          record->tuesday = sVar2;
        }
        else {
          iVar1 = strcmp(pcVar3,"wednesday");
          if (iVar1 == 0) {
            sVar2 = parse_service_availability(field_values[uVar4]);
            record->wednesday = sVar2;
          }
          else {
            iVar1 = strcmp(pcVar3,"thursday");
            if (iVar1 == 0) {
              sVar2 = parse_service_availability(field_values[uVar4]);
              record->thursday = sVar2;
            }
            else {
              iVar1 = strcmp(pcVar3,"friday");
              if (iVar1 == 0) {
                sVar2 = parse_service_availability(field_values[uVar4]);
                record->friday = sVar2;
              }
              else {
                iVar1 = strcmp(pcVar3,"saturday");
                if (iVar1 == 0) {
                  sVar2 = parse_service_availability(field_values[uVar4]);
                  record->saturday = sVar2;
                }
                else {
                  iVar1 = strcmp(pcVar3,"sunday");
                  if (iVar1 == 0) {
                    sVar2 = parse_service_availability(field_values[uVar4]);
                    record->sunday = sVar2;
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void read_calendar_record(calendar_record_t *record, int field_count, const char **field_names, const char **field_values) {
    init_calendar_record(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "start_date") == 0) {
            strcpy(record->start_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "end_date") == 0) {
            strcpy(record->end_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "monday") == 0) {
            record->monday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "tuesday") == 0) {
            record->tuesday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wednesday") == 0) {
            record->wednesday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "thursday") == 0) {
            record->thursday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "friday") == 0) {
            record->friday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "saturday") == 0) {
            record->saturday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "sunday") == 0) {
            record->sunday = parse_service_availability(field_values[i]);
            continue;
        }
    }
}